

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

PrimitiveInstantiationSyntax * __thiscall
slang::parsing::Parser::parsePrimitiveInstantiation(Parser *this,AttrList attributes)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token type_00;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  Token semi_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Delay3Syntax *pDVar4;
  Diagnostic *pDVar5;
  undefined4 extraout_var;
  PrimitiveInstantiationSyntax *pPVar6;
  EVP_PKEY_CTX *src;
  undefined8 in_RSI;
  ParserBase *in_RDI;
  Token TVar7;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  Token semi;
  SourceRange range;
  ExpressionSyntax *d3;
  TimingControlSyntax *delay;
  NetStrengthSyntax *strength;
  Token type;
  ParserBase *in_stack_fffffffffffffc38;
  Diagnostic *in_stack_fffffffffffffc40;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffffc4c;
  TokenKind in_stack_fffffffffffffc4e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc50;
  ParserBase *in_stack_fffffffffffffc58;
  DriveStrengthSyntax *pDVar9;
  SourceLocation in_stack_fffffffffffffc60;
  SyntaxNode *pSVar10;
  SourceLocation in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  DiagCode code;
  ParserBase *pPVar11;
  Diagnostic *in_stack_fffffffffffffc80;
  Info *pIVar12;
  size_t in_stack_fffffffffffffc88;
  SyntaxNode *in_stack_fffffffffffffc90;
  TokenKind in_stack_fffffffffffffcce;
  TimingControlSyntax local_300 [2];
  undefined8 local_2c8;
  Info *pIStack_2c0;
  undefined8 local_2b8;
  undefined8 in_stack_fffffffffffffd50;
  RequireItems requireItems;
  Parser *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  TokenKind in_stack_fffffffffffffd64;
  TokenKind in_stack_fffffffffffffd66;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffd68;
  ParserBase *in_stack_fffffffffffffd70;
  DiagCode in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd88;
  AllowEmpty in_stack_fffffffffffffd90;
  Parser *in_stack_fffffffffffffd98;
  undefined1 local_258 [16];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_248 [4];
  NetStrengthSyntax *local_170;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSStack_168;
  SourceRange local_160;
  string_view local_150;
  SourceLocation local_140;
  SourceLocation local_138;
  undefined4 local_12c;
  SourceLocation local_128;
  SourceLocation local_120;
  undefined4 local_114;
  SourceRange local_110;
  ExpressionSyntax *local_100;
  SourceRange local_f8;
  string_view local_e8;
  SourceRange local_d8;
  undefined4 local_c4;
  SyntaxNode *local_c0;
  SourceRange local_b8;
  string_view local_a8;
  SourceRange local_98;
  undefined4 local_84;
  undefined8 local_80;
  Info *local_78;
  Token local_70;
  DriveStrengthSyntax *local_60;
  Token local_58;
  Token local_48;
  Token local_38;
  undefined8 local_28;
  Info *pIStack_20;
  undefined8 local_10;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances;
  
  requireItems = (RequireItems)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  code = SUB84((ulong)in_stack_fffffffffffffc70 >> 0x20,0);
  local_10 = in_RSI;
  Token::Token((Token *)in_stack_fffffffffffffc40);
  local_38 = ParserBase::peek(in_stack_fffffffffffffc38);
  bVar1 = slang::syntax::SyntaxFacts::isGateType(local_38.kind);
  if (bVar1) {
    TVar7 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffc60);
    local_48._0_8_ = TVar7._0_8_;
    local_28._0_2_ = local_48.kind;
    local_28._2_1_ = local_48._2_1_;
    local_28._3_1_ = local_48.numFlags.raw;
    local_28._4_4_ = local_48.rawLen;
    local_48.info = TVar7.info;
    pIStack_20 = local_48.info;
    local_48 = TVar7;
  }
  else {
    TVar7 = ParserBase::expect(in_RDI,in_stack_fffffffffffffcce);
    local_58._0_8_ = TVar7._0_8_;
    local_28._0_2_ = local_58.kind;
    local_28._2_1_ = local_58._2_1_;
    local_28._3_1_ = local_58.numFlags.raw;
    local_28._4_4_ = local_58.rawLen;
    local_58.info = TVar7.info;
    pIStack_20 = local_58.info;
    local_58 = TVar7;
  }
  local_60 = (DriveStrengthSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc50._M_extent_value,
                           in_stack_fffffffffffffc4e);
  bVar2 = false;
  if (bVar1) {
    local_70 = ParserBase::peek((ParserBase *)
                                CONCAT26(in_stack_fffffffffffffc4e,
                                         CONCAT24(in_stack_fffffffffffffc4c,
                                                  in_stack_fffffffffffffc48)),
                                (uint32_t)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    bVar2 = slang::syntax::SyntaxFacts::isDriveStrength(local_70.kind);
  }
  if (bVar2 != false) {
    if (((short)local_28 == 0xf5) || ((short)local_28 == 0xf4)) {
      local_80 = local_28;
      local_78 = pIStack_20;
      TVar7.rawLen._0_2_ = in_stack_fffffffffffffd64;
      TVar7.kind = (short)in_stack_fffffffffffffd60;
      TVar7._2_1_ = (char)((uint)in_stack_fffffffffffffd60 >> 0x10);
      TVar7.numFlags.raw = (char)((uint)in_stack_fffffffffffffd60 >> 0x18);
      TVar7.rawLen._2_2_ = in_stack_fffffffffffffd66;
      TVar7.info = (Info *)in_stack_fffffffffffffd68;
      local_60 = (DriveStrengthSyntax *)parsePullStrength(in_stack_fffffffffffffd58,TVar7);
    }
    else {
      local_60 = parseDriveStrength(in_stack_fffffffffffffd98);
      if ((((((short)local_28 == 0x7b) || ((short)local_28 == 0xdf)) || ((short)local_28 == 0xeb))
          || (((short)local_28 == 0xfd || ((ushort)((short)local_28 - 0x107U) < 5)))) ||
         ((ushort)((short)local_28 - 0x12fU) < 3)) {
        local_84 = 0x240005;
        local_98 = Token::range((Token *)in_stack_fffffffffffffc60);
        range_03.endLoc = in_stack_fffffffffffffc68;
        range_03.startLoc = in_stack_fffffffffffffc60;
        ParserBase::addDiag(in_stack_fffffffffffffc58,code,range_03);
        local_a8 = Token::valueText((Token *)in_stack_fffffffffffffc50._M_extent_value);
        arg._M_str = (char *)in_stack_fffffffffffffc90;
        arg._M_len = in_stack_fffffffffffffc88;
        Diagnostic::operator<<(in_stack_fffffffffffffc80,arg);
        local_b8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc90);
        range_00.startLoc._4_2_ = in_stack_fffffffffffffc4c;
        range_00.startLoc._0_4_ = in_stack_fffffffffffffc48;
        range_00.startLoc._6_2_ = in_stack_fffffffffffffc4e;
        range_00.endLoc = (SourceLocation)in_stack_fffffffffffffc50._M_extent_value;
        Diagnostic::operator<<(in_stack_fffffffffffffc40,range_00);
      }
    }
  }
  local_c0 = &parseDelay3((Parser *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))->
              super_SyntaxNode;
  if (local_c0 == (SyntaxNode *)0x0) goto LAB_002fd94e;
  if (((((short)local_28 != 2) && ((short)local_28 != 99)) &&
      (((short)local_28 != 0x6f &&
       ((((short)local_28 != 0xda && ((short)local_28 != 0xe0)) && ((short)local_28 != 0xe2)))))) &&
     ((short)local_28 != 0xe6)) {
    if (((ushort)((short)local_28 - 0xf4U) < 2) || ((short)local_28 == 0x109)) {
LAB_002fd6f6:
      local_c4 = 0x1e0005;
      local_d8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc90);
      range_04.endLoc = in_stack_fffffffffffffc68;
      range_04.startLoc = in_stack_fffffffffffffc60;
      ParserBase::addDiag(in_stack_fffffffffffffc58,code,range_04);
      local_e8 = Token::valueText((Token *)in_stack_fffffffffffffc50._M_extent_value);
      arg_00._M_str = (char *)in_stack_fffffffffffffc90;
      arg_00._M_len = in_stack_fffffffffffffc88;
      Diagnostic::operator<<(in_stack_fffffffffffffc80,arg_00);
      local_f8 = Token::range((Token *)in_stack_fffffffffffffc60);
      range_01.startLoc._4_2_ = in_stack_fffffffffffffc4c;
      range_01.startLoc._0_4_ = in_stack_fffffffffffffc48;
      range_01.startLoc._6_2_ = in_stack_fffffffffffffc4e;
      range_01.endLoc = (SourceLocation)in_stack_fffffffffffffc50._M_extent_value;
      Diagnostic::operator<<(in_stack_fffffffffffffc40,range_01);
      goto LAB_002fd94e;
    }
    if (1 < (ushort)((short)local_28 - 0x10aU)) {
      if ((short)local_28 == 0x12f) goto LAB_002fd6f6;
      if ((1 < (ushort)((short)local_28 - 0x130U)) && (1 < (ushort)((short)local_28 - 0x153U)))
      goto LAB_002fd94e;
    }
  }
  if (local_c0->kind == Delay3) {
    pDVar4 = slang::syntax::SyntaxNode::as<slang::syntax::Delay3Syntax>(local_c0);
    local_100 = pDVar4->delay3;
    if (local_100 != (ExpressionSyntax *)0x0) {
      local_110 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc90);
      if ((short)local_28 == 2) {
        local_114 = 0x1d0005;
        local_128 = local_110.startLoc;
        local_120 = local_110.endLoc;
        range_05.endLoc = in_stack_fffffffffffffc68;
        range_05.startLoc = in_stack_fffffffffffffc60;
        ParserBase::addDiag(in_stack_fffffffffffffc58,code,range_05);
      }
      else {
        local_12c = 0x1c0005;
        local_140 = local_110.startLoc;
        local_138 = local_110.endLoc;
        range_06.endLoc = in_stack_fffffffffffffc68;
        range_06.startLoc = in_stack_fffffffffffffc60;
        pDVar5 = ParserBase::addDiag(in_stack_fffffffffffffc58,code,range_06);
        local_150 = Token::valueText((Token *)in_stack_fffffffffffffc50._M_extent_value);
        arg_01._M_str = (char *)pDVar5;
        arg_01._M_len = in_stack_fffffffffffffc88;
        Diagnostic::operator<<(in_stack_fffffffffffffc80,arg_01);
        local_160 = Token::range((Token *)in_stack_fffffffffffffc60);
        range_02.startLoc._4_2_ = in_stack_fffffffffffffc4c;
        range_02.startLoc._0_4_ = in_stack_fffffffffffffc48;
        range_02.startLoc._6_2_ = in_stack_fffffffffffffc4e;
        range_02.endLoc = (SourceLocation)in_stack_fffffffffffffc50._M_extent_value;
        Diagnostic::operator<<(in_stack_fffffffffffffc40,range_02);
      }
    }
  }
LAB_002fd94e:
  Token::Token((Token *)in_stack_fffffffffffffc40);
  pIVar12 = (Info *)(local_258 + 0x10);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x2fd972);
  local_258._12_4_ = 0x400005;
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_258;
  uVar8 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parsePrimitiveInstantiation(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd66,
             in_stack_fffffffffffffd64,(Token *)in_stack_fffffffffffffd58,requireItems,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
  pPVar11 = in_RDI + 1;
  local_2b8 = local_10;
  elements._M_ptr._4_2_ = in_stack_fffffffffffffc4c;
  elements._M_ptr._0_4_ = uVar8;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffc4e;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffc50._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements);
  local_2c8 = local_28;
  pIStack_2c0 = pIStack_20;
  pDVar9 = local_60;
  pSVar10 = local_c0;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_258 + 0x10),
                     (EVP_PKEY_CTX *)in_RDI->alloc,src);
  instances = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
              CONCAT44(extraout_var,iVar3);
  elements_00._M_ptr._4_2_ = in_stack_fffffffffffffc4c;
  elements_00._M_ptr._0_4_ = uVar8;
  elements_00._M_ptr._6_2_ = in_stack_fffffffffffffc4e;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffc50._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,elements_00);
  type_00.info = (Info *)pSVar10;
  type_00._0_8_ = pDVar9;
  semi_00.info = pIVar12;
  semi_00._0_8_ = pPVar11;
  pPVar6 = slang::syntax::SyntaxFactory::primitiveInstantiation
                     ((SyntaxFactory *)in_stack_fffffffffffffc50._M_extent_value,pSStack_168,type_00
                      ,local_170,local_300,instances,semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x2fdb00);
  return pPVar6;
}

Assistant:

PrimitiveInstantiationSyntax& Parser::parsePrimitiveInstantiation(AttrList attributes) {
    Token type;
    if (isGateType(peek().kind))
        type = consume();
    else
        type = expect(TokenKind::Identifier);

    NetStrengthSyntax* strength = nullptr;
    if (peek(TokenKind::OpenParenthesis) && isDriveStrength(peek(1).kind)) {
        if (type.kind == TokenKind::PullUpKeyword || type.kind == TokenKind::PullDownKeyword)
            strength = parsePullStrength(type);
        else {
            strength = parseDriveStrength();
            SLANG_ASSERT(strength);
            switch (type.kind) {
                case TokenKind::CmosKeyword:
                case TokenKind::RcmosKeyword:
                case TokenKind::NmosKeyword:
                case TokenKind::PmosKeyword:
                case TokenKind::RnmosKeyword:
                case TokenKind::RpmosKeyword:
                case TokenKind::TranIf0Keyword:
                case TokenKind::TranIf1Keyword:
                case TokenKind::RtranIf0Keyword:
                case TokenKind::RtranIf1Keyword:
                case TokenKind::TranKeyword:
                case TokenKind::RtranKeyword:
                    addDiag(diag::DriveStrengthNotAllowed, type.range())
                        << type.valueText() << strength->sourceRange();
                    break;
                default:
                    break;
            }
        }
    }

    auto delay = parseDelay3();
    if (delay) {
        switch (type.kind) {
            case TokenKind::PullDownKeyword:
            case TokenKind::PullUpKeyword:
            case TokenKind::TranKeyword:
            case TokenKind::RtranKeyword:
                addDiag(diag::DelaysNotAllowed, delay->sourceRange())
                    << type.valueText() << type.range();
                break;
            case TokenKind::AndKeyword:
            case TokenKind::NandKeyword:
            case TokenKind::OrKeyword:
            case TokenKind::NorKeyword:
            case TokenKind::XorKeyword:
            case TokenKind::XnorKeyword:
            case TokenKind::BufKeyword:
            case TokenKind::NotKeyword:
            case TokenKind::TranIf0Keyword:
            case TokenKind::TranIf1Keyword:
            case TokenKind::RtranIf0Keyword:
            case TokenKind::RtranIf1Keyword:
            case TokenKind::Identifier:
                if (delay->kind == SyntaxKind::Delay3) {
                    if (auto d3 = delay->as<Delay3Syntax>().delay3) {
                        auto range = d3->sourceRange();
                        if (type.kind == TokenKind::Identifier) {
                            addDiag(diag::Delay3UdpNotAllowed, range);
                        }
                        else {
                            addDiag(diag::Delay3NotAllowed, range)
                                << type.valueText() << type.range();
                        }
                    }
                }
                break;
            default:
                break;
        }
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.primitiveInstantiation(attributes, type, strength, delay, items.copy(alloc),
                                          semi);
}